

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
cpptrace::detail::
optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>::swap
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
           *this,optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                 *other)

{
  undefined8 *puVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pcVar4;
  undefined8 uVar5;
  
  if (this->holds_value == true) {
    if (other->holds_value == false) {
      puVar1 = (undefined8 *)((long)&other->field_0 + 0x10);
      *(undefined8 **)&other->field_0 = puVar1;
      pcVar4 = (this->field_0).uvalue._M_dataplus._M_p;
      pcVar2 = (pointer)((long)&this->field_0 + 0x10);
      if (pcVar4 == pcVar2) {
        uVar5 = *(undefined8 *)((long)&this->field_0 + 0x18);
        *puVar1 = *(undefined8 *)pcVar2;
        *(undefined8 *)((long)&other->field_0 + 0x18) = uVar5;
      }
      else {
        (other->field_0).uvalue._M_dataplus._M_p = pcVar4;
        *(undefined8 *)((long)&other->field_0 + 0x10) = *(undefined8 *)pcVar2;
      }
      (other->field_0).uvalue._M_string_length = (this->field_0).uvalue._M_string_length;
      *(pointer *)&this->field_0 = pcVar2;
      (this->field_0).uvalue._M_string_length = 0;
      *(undefined1 *)((long)&this->field_0 + 0x10) = 0;
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::swap
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)other);
    }
  }
  else if (other->holds_value != false) {
    puVar1 = (undefined8 *)((long)&this->field_0 + 0x10);
    *(undefined8 **)&this->field_0 = puVar1;
    pcVar4 = (other->field_0).uvalue._M_dataplus._M_p;
    pcVar2 = (pointer)((long)&other->field_0 + 0x10);
    if (pcVar4 == pcVar2) {
      uVar5 = *(undefined8 *)((long)&other->field_0 + 0x18);
      *puVar1 = *(undefined8 *)pcVar2;
      *(undefined8 *)((long)&this->field_0 + 0x18) = uVar5;
    }
    else {
      (this->field_0).uvalue._M_dataplus._M_p = pcVar4;
      *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)pcVar2;
    }
    (this->field_0).uvalue._M_string_length = (other->field_0).uvalue._M_string_length;
    *(pointer *)&other->field_0 = pcVar2;
    (other->field_0).uvalue._M_string_length = 0;
    *(undefined1 *)((long)&other->field_0 + 0x10) = 0;
  }
  bVar3 = this->holds_value;
  this->holds_value = other->holds_value;
  other->holds_value = bVar3;
  return;
}

Assistant:

void swap(optional& other) noexcept {
            if(holds_value && other.holds_value) {
                std::swap(uvalue, other.uvalue);
            } else if(holds_value && !other.holds_value) {
                new (&other.uvalue) T(std::move(uvalue));
                uvalue.~T();
            } else if(!holds_value && other.holds_value) {
                new (static_cast<void*>(std::addressof(uvalue))) T(std::move(other.uvalue));
                other.uvalue.~T();
            }
            std::swap(holds_value, other.holds_value);
        }